

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O3

void __thiscall Vault::KeyValue::KeyValue(KeyValue *this,Client *client,Version version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *local_38;
  size_type local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  this->client_ = client;
  this->version_ = version;
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"secret","");
  paVar1 = &(this->mount_).value_.field_2;
  (this->mount_).value_._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = local_28;
    *(undefined8 *)((long)&(this->mount_).value_.field_2 + 8) = uStack_20;
  }
  else {
    (this->mount_).value_._M_dataplus._M_p = (pointer)local_38;
    (this->mount_).value_.field_2._M_allocated_capacity = local_28;
  }
  (this->mount_).value_._M_string_length = local_30;
  return;
}

Assistant:

Vault::KeyValue::KeyValue(const Vault::Client &client,
                          KeyValue::Version version)
    : client_(client)
    , version_(version)
    , mount_("secret") {}